

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuilder.c
# Opt level: O2

strbuilder * strbuilder_append_string(strbuilder *builder,char *str)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (builder == (strbuilder *)0x0) {
LAB_0010ead2:
    builder = (strbuilder *)0x0;
  }
  else {
    for (; cVar1 = *str, cVar1 != '\0'; str = str + 1) {
      pcVar3 = builder->position;
      if (pcVar3 == builder->buffer_end) {
        sVar2 = increase_size(builder);
        if (sVar2 == 0) goto LAB_0010ead2;
        cVar1 = *str;
        pcVar3 = builder->position;
      }
      *pcVar3 = cVar1;
      builder->position = builder->position + 1;
    }
  }
  return builder;
}

Assistant:

struct strbuilder *
strbuilder_append_string( struct strbuilder *builder, const char *str ) {
  const char *curr;
  size_t old_size;

  if( !builder ) {
    return NULL;
  }

  curr = str;
  while ( *curr != '\0' ) {
    if( builder->position == builder->buffer_end ) {
      old_size = increase_size( builder );
      if( old_size == 0 ) {
        return NULL;
      }
    }

    *( builder->position ) = *curr;
    builder->position++;

    curr++;
  }

  return builder;
}